

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

Template * __thiscall
inja::Environment::parse(Template *__return_storage_ptr__,Environment *this,string_view input)

{
  Parser parser;
  path pStack_1d8;
  Parser local_1b0;
  
  Parser::Parser(&local_1b0,&this->parser_config,&this->lexer_config,&this->template_storage,
                 &this->function_storage);
  std::filesystem::__cxx11::path::path(&pStack_1d8,&this->input_path);
  Parser::parse(__return_storage_ptr__,&local_1b0,input,&pStack_1d8);
  std::filesystem::__cxx11::path::~path(&pStack_1d8);
  Parser::~Parser(&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

Template parse(std::string_view input) {
    Parser parser(parser_config, lexer_config, template_storage, function_storage);
    return parser.parse(input, input_path);
  }